

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O2

void iDynTree::XMLParser::XMLParserPimpl::parserCallbackStartDocument(void *context)

{
  stack<std::shared_ptr<iDynTree::XMLElement>,_std::deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>_>
  local_60;
  
  if (*(char *)(*context + 0x1a1) == '\x01') {
    iDynTree::reportInfo("XMLParser","parserCallbackStartDocument","Start document");
  }
  std::
  stack<std::shared_ptr<iDynTree::XMLElement>,std::deque<std::shared_ptr<iDynTree::XMLElement>,std::allocator<std::shared_ptr<iDynTree::XMLElement>>>>
  ::
  stack<std::deque<std::shared_ptr<iDynTree::XMLElement>,std::allocator<std::shared_ptr<iDynTree::XMLElement>>>,void>
            (&local_60);
  std::
  deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  ::_M_move_assign1((deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
                     *)(*context + 0x100),&local_60);
  std::
  deque<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
  ::~deque(&local_60.c);
  std::function<std::shared_ptr<iDynTree::XMLDocument>_(iDynTree::XMLParserState_&)>::operator()
            ((function<std::shared_ptr<iDynTree::XMLDocument>_(iDynTree::XMLParserState_&)> *)
             &local_60,(XMLParserState *)(*context + 0x150));
  std::__shared_ptr<iDynTree::XMLDocument,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<iDynTree::XMLDocument,_(__gnu_cxx::_Lock_policy)2> *)(*context + 0x170),
             (__shared_ptr<iDynTree::XMLDocument,_(__gnu_cxx::_Lock_policy)2> *)&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_60.c.
              super__Deque_base<std::shared_ptr<iDynTree::XMLElement>,_std::allocator<std::shared_ptr<iDynTree::XMLElement>_>_>
              ._M_impl.super__Deque_impl_data._M_map_size);
  return;
}

Assistant:

void XMLParser::XMLParserPimpl::parserCallbackStartDocument(void* context)
    {
        XMLParser *state = static_cast<XMLParser*>(context);
        if (state->m_pimpl->m_logParsing) {
            reportInfo("XMLParser", "parserCallbackStartDocument", "Start document");
        }
        // clear stack
        state->m_pimpl->m_parsedTrace = std::stack<std::shared_ptr<XMLElement>>();
        // create a Document type
        state->m_pimpl->m_document = std::shared_ptr<XMLDocument>(
            state->m_pimpl->f_documentFactory(state->m_pimpl->m_parserState));
    }